

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O2

void HorizontalPred_SSE2(uint8_t *dst,uint8_t *left,int size)

{
  int j;
  long lVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  
  if (left != (uint8_t *)0x0) {
    lVar1 = 0;
    if (size == 8) {
      for (; lVar1 != 8; lVar1 = lVar1 + 1) {
        auVar3 = ZEXT216(CONCAT11(left[lVar1],left[lVar1]));
        auVar3 = pshuflw(auVar3,auVar3,0);
        *(long *)dst = auVar3._0_8_;
        dst = dst + 0x20;
      }
    }
    else {
      for (; lVar1 != 0x10; lVar1 = lVar1 + 1) {
        auVar3 = ZEXT216(CONCAT11(left[lVar1],left[lVar1]));
        auVar3 = pshuflw(auVar3,auVar3,0);
        uVar2 = auVar3._0_4_;
        *(undefined4 *)dst = uVar2;
        *(undefined4 *)(dst + 4) = uVar2;
        *(undefined4 *)(dst + 8) = uVar2;
        *(undefined4 *)(dst + 0xc) = uVar2;
        dst = dst + 0x20;
      }
    }
    return;
  }
  Fill_SSE2(dst,0x81,size);
  return;
}

Assistant:

static WEBP_INLINE void HorizontalPred_SSE2(uint8_t* WEBP_RESTRICT dst,
                                            const uint8_t* WEBP_RESTRICT left,
                                            int size) {
  if (left != NULL) {
    if (size == 8) {
      HE8uv_SSE2(dst, left);
    } else {
      HE16_SSE2(dst, left);
    }
  } else {
    Fill_SSE2(dst, 129, size);
  }
}